

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

void xc_bspline(int i,int p,double u,int nderiv,double *U,double *ders)

{
  size_t __n;
  double dVar1;
  int j_1;
  long lVar2;
  int iVar3;
  int iVar4;
  double *pdVar5;
  ulong uVar6;
  long lVar7;
  int j;
  double (*padVar8) [8];
  int iVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double ND [5];
  double N [8] [8];
  
  __n = (long)nderiv * 8 + 8;
  memset(ders,0,__n);
  dVar11 = U[i];
  if ((dVar11 <= u) && (iVar9 = i + p, u < U[(long)iVar9 + 1])) {
    memset(N,0,0x200);
    lVar2 = (long)p;
    for (lVar10 = 0; lVar10 <= lVar2; lVar10 = lVar10 + 1) {
      dVar12 = 0.0;
      if (U[i + lVar10] <= u) {
        dVar12 = (double)(-(ulong)(u < U[(long)i + lVar10 + 1]) & 0x3ff0000000000000);
      }
      N[0][lVar10] = dVar12;
    }
    iVar3 = 0;
    if (0 < p) {
      iVar3 = p;
    }
    padVar8 = N;
    pdVar5 = U + (long)i + 2;
    for (uVar6 = 1; padVar8 = padVar8 + 1, uVar6 != iVar3 + 1; uVar6 = uVar6 + 1) {
      dVar12 = N[uVar6 - 1][0];
      dVar13 = 0.0;
      if ((dVar12 != 0.0) || (NAN(dVar12))) {
        dVar13 = (dVar12 * (u - dVar11)) / (U[(long)i + uVar6] - dVar11);
      }
      for (lVar10 = 0; lVar10 <= (long)(lVar2 - uVar6); lVar10 = lVar10 + 1) {
        dVar12 = padVar8[-1][lVar10 + 1];
        if ((dVar12 != 0.0) || (dVar14 = dVar13, dVar1 = 0.0, NAN(dVar12))) {
          dVar12 = dVar12 / (pdVar5[lVar10] - U[(long)i + lVar10 + 1]);
          dVar14 = dVar13 + (pdVar5[lVar10] - u) * dVar12;
          dVar1 = (u - U[(long)i + lVar10 + 1]) * dVar12;
        }
        dVar13 = dVar1;
        (*padVar8)[lVar10] = dVar14;
      }
      pdVar5 = pdVar5 + 1;
    }
    *ders = N[lVar2][0];
    if (nderiv != 0) {
      if (p <= nderiv) {
        nderiv = p;
      }
      if (nderiv < 1) {
        nderiv = 0;
      }
      padVar8 = N + lVar2;
      lVar2 = 2;
      iVar3 = iVar9;
      for (uVar6 = 1; padVar8 = padVar8 + -1, uVar6 != nderiv + 1; uVar6 = uVar6 + 1) {
        memset(ND,0,__n);
        for (lVar10 = 0; lVar2 != lVar10; lVar10 = lVar10 + 1) {
          ND[lVar10] = (*padVar8)[lVar10];
        }
        iVar4 = iVar3;
        for (lVar10 = 1; lVar10 != lVar2; lVar10 = lVar10 + 1) {
          dVar11 = 0.0;
          if ((ND[0] != 0.0) || (NAN(ND[0]))) {
            dVar11 = ND[0] / (U[(iVar9 - (int)uVar6) + lVar10] - U[i]);
          }
          for (lVar7 = 0; lVar7 <= (long)(uVar6 - lVar10); lVar7 = lVar7 + 1) {
            dVar12 = ND[lVar7 + 1];
            if ((dVar12 != 0.0) || (dVar13 = dVar11, dVar14 = 0.0, NAN(dVar12))) {
              dVar14 = dVar12 / (U[(long)(iVar4 + (int)lVar7) + 1] - U[(long)i + lVar7 + 1]);
              dVar13 = dVar11 - dVar14;
            }
            dVar11 = dVar14;
            ND[lVar7] = dVar13 * (double)((p - (int)uVar6) + (int)lVar10);
          }
          iVar4 = iVar4 + 1;
        }
        ders[uVar6] = ND[0];
        lVar2 = lVar2 + 1;
        iVar3 = iVar3 + -1;
      }
    }
  }
  return;
}

Assistant:

GPU_FUNCTION void
xc_bspline(int i, int p, double u, int nderiv, const double *U, double *ders) {

  /* Initialize output array */
  libxc_memset(ders, 0, (nderiv+1)*sizeof(double));

  /* Check locality of support */
  if(u < U[i] || u >= U[i+p+1]) {
    return;
  }

  /* Arrays need static sizes for stack allocation */
#define PMAX 8
  assert(p<PMAX);

  /* Array of normalized B splines, use dense storage for simpler code */
  double N[PMAX][PMAX];
  libxc_memset(N, 0, PMAX*PMAX*sizeof(double));

  /* Initialize zeroth-degree functions: piecewise constants */
  for(int j=0; j<=p; j++) {
    N[0][j] = (u >= U[i+j] && u < U[i+j+1]) ? 1.0 : 0.0;
  }

  /* Fill out table of B splines */
  for(int k=1; k<=p; k++) {
    double saved = (N[k-1][0] == 0.0) ? 0.0 : ((u-U[i])*N[k-1][0])/(U[i+k]-U[i]);

    for(int j=0; j<=p-k; j++) {
      double Ul = U[i+j+1];
      double Ur = U[i+j+k+1];
      if(N[k-1][j+1] == 0.0) {
        N[k][j] = saved;
        saved = 0.0;
      } else {
        double temp = N[k-1][j+1] / (Ur-Ul);
        N[k][j] = saved + (Ur-u)*temp;
        saved = (u-Ul)*temp;
      }
    }
  }

  /* Function value */
  ders[0] = N[p][0];
  if(nderiv==0)
    return;

  /* Helper memory */
  assert(nderiv<=4);
  double ND[5]; /* dimension nderiv+1 */
  int maxk = (nderiv < p) ? nderiv : p;

  /* Compute derivatives */
  for(int k=1; k<=maxk; k++) {
    /* Load appropriate column */
    libxc_memset(ND, 0, (nderiv+1)*sizeof(double));
    for(int j=0; j<=k; j++)
      ND[j] = N[p-k][j];

    /* Compute table */
    for(int jj=1; jj<=k; jj++) {
      double saved = (ND[0] == 0.0) ? 0.0 : ND[0]/(U[i+p-k+jj]-U[i]);

      for(int j=0; j<=k-jj; j++) {
        double Ul = U[i+j+1];
        /* the -k term is missing in the book */
        double Ur = U[i+j+p-k+jj+1];
        if(ND[j+1] == 0.0) {
          ND[j] = (p-k+jj)*saved;
          saved = 0.0;
        } else {
          double temp = ND[j+1]/(Ur-Ul);
          ND[j] = (p-k+jj)*(saved-temp);
          saved = temp;
        }
      }
    }
    /* k:th derivative is */
    ders[k] = ND[0];
  }
}